

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_file.hpp
# Opt level: O2

bool __thiscall iutest::StdioFile::OpenImpl(StdioFile *this,char *filename,int mode)

{
  FILE *pFVar1;
  char *__modes;
  
  (*(this->super_IFile).super_IOutStream._vptr_IOutStream[4])();
  if (mode == 1) {
    __modes = "rb";
  }
  else if (mode == 2) {
    __modes = "wb";
  }
  else {
    if (mode != 3) {
      pFVar1 = (FILE *)this->m_fp;
      goto LAB_0011d59e;
    }
    __modes = "ab";
  }
  pFVar1 = fopen64(filename,__modes);
  this->m_fp = (FILE *)pFVar1;
LAB_0011d59e:
  return pFVar1 != (FILE *)0x0;
}

Assistant:

virtual bool OpenImpl(const char* filename, int mode) IUTEST_CXX_OVERRIDE
    {
        Close();
        switch( mode )
        {
        case IFile::OpenRead:
            m_fp = internal::posix::FileOpen(filename, "rb");
            break;
        case IFile::OpenWrite:
            m_fp = internal::posix::FileOpen(filename, "wb");
            break;
        case IFile::OpenAppend:
            m_fp = internal::posix::FileOpen(filename, "ab");
            break;
        default:
            break;
        }
        return m_fp != NULL;
    }